

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

void __thiscall TxConfirmStats::Record(TxConfirmStats *this,int blocksToConfirm,double feerate)

{
  uint uVar1;
  pointer pvVar2;
  pointer pvVar3;
  long lVar4;
  pointer pdVar5;
  const_iterator cVar6;
  ulong uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  double feerate_local;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  feerate_local = feerate;
  if (0 < blocksToConfirm) {
    uVar1 = this->scale;
    cVar6 = std::
            _Rb_tree<double,_std::pair<const_double,_unsigned_int>,_std::_Select1st<std::pair<const_double,_unsigned_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
            ::lower_bound(&this->bucketMap->_M_t,&feerate_local);
    uVar7 = (ulong)*(uint *)&cVar6._M_node[1]._M_parent;
    pvVar2 = (this->confAvg).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = (this->confAvg).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (uVar8 = (ulong)(int)(((blocksToConfirm + uVar1) - 1) / uVar1);
        uVar8 <= (ulong)(((long)pvVar3 - (long)pvVar2) / 0x18); uVar8 = uVar8 + 1) {
      lVar4 = *(long *)&pvVar2[uVar8 - 1].super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data;
      *(double *)(lVar4 + uVar7 * 8) = *(double *)(lVar4 + uVar7 * 8) + 1.0;
    }
    pdVar5 = (this->txCtAvg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5[uVar7] = pdVar5[uVar7] + 1.0;
    pdVar5 = (this->m_feerate_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5[uVar7] = feerate_local + pdVar5[uVar7];
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TxConfirmStats::Record(int blocksToConfirm, double feerate)
{
    // blocksToConfirm is 1-based
    if (blocksToConfirm < 1)
        return;
    int periodsToConfirm = (blocksToConfirm + scale - 1) / scale;
    unsigned int bucketindex = bucketMap.lower_bound(feerate)->second;
    for (size_t i = periodsToConfirm; i <= confAvg.size(); i++) {
        confAvg[i - 1][bucketindex]++;
    }
    txCtAvg[bucketindex]++;
    m_feerate_avg[bucketindex] += feerate;
}